

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void prepare_coeffs_lowbd(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  
  auVar3._16_16_ =
       *(undefined1 (*) [16])
        (filter_params->filter_ptr + (uint)filter_params->taps * (subpel_q4 & 0xfU));
  auVar3._0_16_ =
       *(undefined1 (*) [16])
        (filter_params->filter_ptr + (uint)filter_params->taps * (subpel_q4 & 0xfU));
  auVar3 = vpsraw_avx2(auVar3,1);
  alVar1 = (__m256i)vpshufb_avx2(auVar3,_DAT_004c2140);
  alVar2 = (__m256i)vpshufb_avx2(auVar3,_DAT_004c2160);
  *coeffs = alVar1;
  coeffs[1] = alVar2;
  alVar1 = (__m256i)vpshufb_avx2(auVar3,_DAT_004c2180);
  coeffs[2] = alVar1;
  alVar1 = (__m256i)vpshufb_avx2(auVar3,_DAT_004c21a0);
  coeffs[3] = alVar1;
  return;
}

Assistant:

static inline void prepare_coeffs_lowbd(
    const InterpFilterParams *const filter_params, const int subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);
  const __m256i filter_coeffs = _mm256_broadcastsi128_si256(coeffs_8);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));

  const __m256i coeffs_1 = _mm256_srai_epi16(filter_coeffs, 1);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0e0cu));
}